

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall argstest::PositionalBase::Reset(PositionalBase *this)

{
  PositionalBase *this_local;
  
  (this->super_NamedBase).super_Base.matched = false;
  (this->super_NamedBase).field_0xc1 = 1;
  (this->super_NamedBase).super_Base.error = None;
  std::__cxx11::string::clear();
  return;
}

Assistant:

virtual void Reset() noexcept override
            {
                matched = false;
                ready = true;
#ifdef ARGS_NOEXCEPT
                error = Error::None;
                errorMsg.clear();
#endif
            }